

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::StandardColumnData::Scan
          (StandardColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,idx_t target_count)

{
  ScanVectorType scan_type;
  idx_t iVar1;
  reference state_00;
  
  scan_type = (*(this->super_ColumnData)._vptr_ColumnData[5])(this,state,target_count);
  iVar1 = ColumnData::ScanVector
                    (&this->super_ColumnData,transaction,vector_index,state,result,target_count,
                     scan_type,REGULAR_SCAN);
  state_00 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,0);
  ColumnData::ScanVector
            (&(this->validity).super_ColumnData,transaction,vector_index,state_00,result,
             target_count,scan_type,REGULAR_SCAN);
  return iVar1;
}

Assistant:

idx_t StandardColumnData::Scan(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                               idx_t target_count) {
	D_ASSERT(state.row_index == state.child_states[0].row_index);
	auto scan_type = GetVectorScanType(state, target_count, result);
	auto mode = ScanVectorMode::REGULAR_SCAN;
	auto scan_count = ScanVector(transaction, vector_index, state, result, target_count, scan_type, mode);
	validity.ScanVector(transaction, vector_index, state.child_states[0], result, target_count, scan_type, mode);
	return scan_count;
}